

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

Delay3Control * __thiscall
slang::BumpAllocator::
emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,Expression **args_1,Expression **args_2,
          SourceRange *args_3)

{
  Expression *pEVar1;
  Expression *pEVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  Delay3Control *pDVar5;
  
  pDVar5 = (Delay3Control *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((Delay3Control *)this->endPtr < pDVar5 + 1) {
    pDVar5 = (Delay3Control *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar5 + 1);
  }
  pEVar1 = *args_1;
  pEVar2 = *args_2;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pDVar5->super_TimingControl).kind = Delay3;
  (pDVar5->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pDVar5->super_TimingControl).sourceRange.startLoc = SVar3;
  (pDVar5->super_TimingControl).sourceRange.endLoc = SVar4;
  pDVar5->expr1 = args;
  pDVar5->expr2 = pEVar1;
  pDVar5->expr3 = pEVar2;
  return pDVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }